

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void smooth_h_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  int i;
  uint32_t this_pred;
  uint8_t weights [2];
  uint8_t pixels [2];
  int c;
  int r;
  uint16_t scale;
  int log2_scale;
  uint8_t *sm_weights;
  uint8_t right_pred;
  uint8_t *left_local;
  uint8_t *above_local;
  int bh_local;
  int bw_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  
  pixels[1] = above[bw + -1];
  dst_local = dst;
  for (r = 0; r < bh; r = r + 1) {
    for (c = 0; c < bw; c = c + 1) {
      pixels[0] = left[r];
      weights[0] = (&UNK_00bc84a4)[(long)c + (long)bw];
      weights[1] = -(&UNK_00bc84a4)[(long)c + (long)bw];
      this_pred = 0;
      for (i = 0; i < 2; i = i + 1) {
        this_pred = (uint)weights[i] * (uint)pixels[i] + this_pred;
      }
      dst_local[c] = (uint8_t)(this_pred + 0x80 >> 8);
    }
    dst_local = dst_local + stride;
  }
  return;
}

Assistant:

static inline void smooth_h_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint8_t *above,
                                      const uint8_t *left) {
  const uint8_t right_pred = above[bw - 1];  // estimated by top-right pixel
  const uint8_t *const sm_weights = smooth_weights + bw - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { left[r], right_pred };
      const uint8_t weights[] = { sm_weights[c], scale - sm_weights[c] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[c]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}